

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::
~MatcherBase(MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this)

{
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00169b80;
  Destroy(this);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }